

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O3

int cmOutputConverter::Shell__ArgumentNeedsQuotes(char *in,int flags)

{
  byte *pbVar1;
  byte bVar2;
  byte c_00;
  int iVar3;
  byte *c_01;
  int iVar4;
  char *c;
  
  bVar2 = *in;
  iVar4 = 1;
  c_01 = (byte *)in;
  c_00 = bVar2;
  if (bVar2 != 0) {
    do {
      if ((flags & 0x40U) != 0) {
        c_01 = (byte *)Shell__SkipMakeVariables((char *)c_01);
        c_00 = *c_01;
        if (c_00 == 0) break;
      }
      iVar3 = Shell__CharNeedsQuotes(c_00,flags);
      if (iVar3 != 0) {
        return 1;
      }
      pbVar1 = c_01 + 1;
      c_01 = c_01 + 1;
      c_00 = *pbVar1;
    } while (*pbVar1 != 0);
    if (((((uint)flags >> 8 & 1) == 0) || (in[1] != '\0')) ||
       (((0x3b < bVar2 - 0x23 || ((0x800000010000009U >> ((ulong)(bVar2 - 0x23) & 0x3f) & 1) == 0))
        && (bVar2 != 0x7c)))) {
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int cmOutputConverter::Shell__ArgumentNeedsQuotes(const char* in, int flags)
{
  /* The empty string needs quotes.  */
  if (!*in) {
    return 1;
  }

  /* Scan the string for characters that require quoting.  */
  {
    const char* c;
    for (c = in; *c; ++c) {
      /* Look for $(MAKEVAR) syntax if requested.  */
      if (flags & Shell_Flag_AllowMakeVariables) {
#if KWSYS_SYSTEM_SHELL_QUOTE_MAKE_VARIABLES
        const char* skip = Shell__SkipMakeVariables(c);
        if (skip != c) {
          /* We need to quote make variable references to preserve the
             string with contents substituted in its place.  */
          return 1;
        }
#else
        /* Skip over the make variable references if any are present.  */
        c = Shell__SkipMakeVariables(c);

        /* Stop if we have reached the end of the string.  */
        if (!*c) {
          break;
        }
#endif
      }

      /* Check whether this character needs quotes.  */
      if (Shell__CharNeedsQuotes(*c, flags)) {
        return 1;
      }
    }
  }

  /* On Windows some single character arguments need quotes.  */
  if (flags & Shell_Flag_IsUnix && *in && !*(in + 1)) {
    char c = *in;
    if ((c == '?') || (c == '&') || (c == '^') || (c == '|') || (c == '#')) {
      return 1;
    }
  }

  return 0;
}